

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

QSizeF __thiscall KDReports::ReportPrivate::paperSize(ReportPrivate *this)

{
  qreal qVar1;
  qreal qVar2;
  bool bVar3;
  QSizeF local_40;
  undefined1 local_30 [8];
  QSizeF mmSize;
  ReportPrivate *this_local;
  
  mmSize.ht = (qreal)this;
  bVar3 = QSizeF::isEmpty(&this->m_paperSize);
  if (bVar3) {
    local_30 = (undefined1  [8])QPageSize::size((int)this + 0x28);
    qVar1 = QSizeF::width((QSizeF *)local_30);
    qVar1 = mmToPixels(qVar1);
    qVar2 = QSizeF::height((QSizeF *)local_30);
    qVar2 = mmToPixels(qVar2);
    QSizeF::QSizeF(&local_40,qVar1,qVar2);
    (this->m_paperSize).wd = local_40.wd;
    (this->m_paperSize).ht = local_40.ht;
    if (this->m_orientation == Landscape) {
      QSizeF::transpose();
    }
  }
  return this->m_paperSize;
}

Assistant:

QSizeF KDReports::ReportPrivate::paperSize() const
{
    // determine m_paperSize from m_pageSize if needed
    if (m_paperSize.isEmpty()) {
        const auto mmSize = m_pageSize.size(QPageSize::Millimeter);
        m_paperSize = QSizeF {mmToPixels(mmSize.width()), mmToPixels(mmSize.height())};
        if (m_orientation == QPageLayout::Landscape) {
            m_paperSize.transpose();
        }
    }
    // qDebug() << "m_paperSize=" << m_paperSize;
    return m_paperSize;
}